

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BinTree.h
# Opt level: O0

Iterator __thiscall
axl::sl::
BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
::visit(BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
        *this,int key)

{
  RbTreeNode<int,_int> *p;
  int in_ESI;
  RbTreeNode<int,_int> *in_RDI;
  int cmp;
  RbTreeNode<int,_int> *node;
  RbTreeNode<int,_int> *parent;
  RbTreeNode<int,_int> *in_stack_ffffffffffffff88;
  RbTreeNode<int,_int> *in_stack_ffffffffffffff90;
  RbTreeNode<int,_int> *local_68;
  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  in_stack_ffffffffffffffa8;
  RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int> *in_stack_ffffffffffffffb0;
  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  in_stack_ffffffffffffffb8;
  int local_2c;
  RbTreeNode<int,_int> *local_28;
  RbTreeNode<int,_int> *local_20;
  IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  local_8;
  
  local_20 = (RbTreeNode<int,_int> *)0x0;
  local_28 = (in_RDI->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).m_parent;
  while( true ) {
    if (local_28 == (RbTreeNode<int,_int> *)0x0) {
      p = (RbTreeNode<int,_int> *)
          operator_new((size_t)in_stack_ffffffffffffff90,(ZeroInit_t *)in_stack_ffffffffffffff88);
      (p->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).super_MapEntry<int,_int>.
      m_key = in_ESI;
      (p->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).m_parent = local_20;
      if (local_20 == (RbTreeNode<int,_int> *)0x0) {
        (in_RDI->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).m_parent = p;
        ListBase<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>_>
        ::insertTail((ListBase<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>_>
                      *)in_stack_ffffffffffffffa8.m_p,in_RDI);
        p = in_stack_ffffffffffffff88;
      }
      else if (local_2c < 0) {
        (local_20->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).m_left = p;
        Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
        ::Iterator((Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
                    *)p,in_stack_ffffffffffffff88);
        in_stack_ffffffffffffff90 = p;
        ListBase<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>_>
        ::insertBefore((ListBase<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>_>
                        *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8.m_p,
                       (Iterator)in_stack_ffffffffffffffb8.m_p);
        p = in_stack_ffffffffffffff88;
      }
      else {
        (local_20->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).m_right = p;
        Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
        ::Iterator((Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
                    *)in_stack_ffffffffffffff90,p);
        in_stack_ffffffffffffffa8.m_p =
             (Entry *)ListBase<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>_>
                      ::insertAfter((ListBase<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>_>
                                     *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8.m_p,
                                    in_stack_ffffffffffffffb8.m_p);
      }
      RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>::onInsert
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8.m_p);
      Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
      ::Iterator((Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
                  *)in_stack_ffffffffffffff90,p);
      return (Iterator)
             local_8.
             super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
             .m_p;
    }
    local_2c = Cmp<int,_int>::operator()
                         ((Cmp<int,_int> *)
                          &(in_RDI->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).
                           m_left,in_ESI,
                          (local_28->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>)
                          .super_MapEntry<int,_int>.m_key);
    if (local_2c == 0) break;
    local_20 = local_28;
    if (local_2c < 0) {
      local_68 = (local_28->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).m_left;
    }
    else {
      local_68 = (local_28->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).m_right;
    }
    local_28 = local_68;
  }
  Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  ::Iterator((Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
              *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  return (Iterator)
         local_8.
         super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
         .m_p.m_p;
}

Assistant:

Iterator
	visit(KeyArg key) {
		Node* parent = NULL;
		Node* node = m_root;

		// find the place to insert

		int cmp;

		while (node) {
			cmp = m_cmp(key, node->m_key);
			if (cmp == 0)
				return node;

			parent = node;
			node = cmp < 0 ? node->m_left : node->m_right;
		}

		// create and insert new node

		node = new (mem::ZeroInit) Node;
		node->m_key = key;
		node->m_parent = parent;

		if (!parent) {
			m_root = node;
			m_nodeList.insertTail(node);
		} else if (cmp < 0) {
			parent->m_left = node;
			m_nodeList.insertBefore(node, parent);
		} else {
			parent->m_right = node;
			m_nodeList.insertAfter(node, parent);
		}

		static_cast<T*>(this)->onInsert(node);
		return node;
	}